

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int mbedtls_x509_crt_is_revoked(mbedtls_x509_crt *crt,mbedtls_x509_crl *crl)

{
  size_t __n;
  int iVar1;
  mbedtls_x509_crl_entry *pmVar2;
  
  pmVar2 = &crl->entry;
  while( true ) {
    __n = (pmVar2->serial).len;
    if (__n == 0) {
      return 0;
    }
    if ((((crt->serial).len == __n) &&
        (iVar1 = bcmp((crt->serial).p,(pmVar2->serial).p,__n), iVar1 == 0)) &&
       (iVar1 = mbedtls_x509_time_is_past(&pmVar2->revocation_date), iVar1 != 0)) break;
    pmVar2 = pmVar2->next;
    if (pmVar2 == (mbedtls_x509_crl_entry *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int mbedtls_x509_crt_is_revoked( const mbedtls_x509_crt *crt, const mbedtls_x509_crl *crl )
{
    const mbedtls_x509_crl_entry *cur = &crl->entry;

    while( cur != NULL && cur->serial.len != 0 )
    {
        if( crt->serial.len == cur->serial.len &&
            memcmp( crt->serial.p, cur->serial.p, crt->serial.len ) == 0 )
        {
            if( mbedtls_x509_time_is_past( &cur->revocation_date ) )
                return( 1 );
        }

        cur = cur->next;
    }

    return( 0 );
}